

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O3

void __thiscall
adios2::fstream::fstream
          (fstream *this,string *name,openmode mode,MPI_Comm comm,string *configFile,
          string *ioInConfigFile)

{
  undefined1 local_49;
  ompi_communicator_t local_48 [8];
  string *local_40;
  Mode local_34;
  
  local_40 = configFile;
  local_34 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI(local_48);
  (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::Stream,std::allocator<adios2::core::Stream>,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[4]>
            (&(this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Stream **)this,(allocator<adios2::core::Stream> *)&local_49,name,
             &local_34,(Comm *)local_48,local_40,ioInConfigFile,(char (*) [4])"C++");
  adios2::helper::Comm::~Comm((Comm *)local_48);
  return;
}

Assistant:

fstream::fstream(const std::string &name, const openmode mode, MPI_Comm comm,
                 const std::string &configFile, const std::string ioInConfigFile)
: m_Stream(std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm), configFile,
                                          ioInConfigFile, "C++"))
{
}